

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low-level.cpp
# Opt level: O3

int __thiscall spatial_region::init(spatial_region *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  pwpo *ppVar2;
  particle **pppVar3;
  five_point_solver *this_00;
  _Requires<_Callable<void_(&)(particle_&,_vector3d_&,_vector3d_&,_double)>,_function<void_(particle_&,_vector3d_&,_vector3d_&,_double_&)>_&>
  pfVar4;
  undefined7 extraout_var;
  int in_ECX;
  int in_EDX;
  code *__f;
  maxwell_solver *pmVar6;
  int in_R8D;
  int in_R9D;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  double *in_stack_00000008;
  int in_stack_00000018;
  int in_stack_00000020;
  _Manager_type p_Var5;
  
  this->sr_id = (int)ctx;
  this->dx = in_XMM0_Qa;
  this->dy = in_XMM1_Qa;
  this->dz = in_XMM2_Qa;
  this->dt = in_XMM3_Qa;
  this->e_s = in_XMM4_Qa;
  this->xnpic = in_EDX;
  this->ynpic = in_ECX;
  this->znpic = in_R8D;
  this->n_ion_populations = in_R9D;
  this->icmr = in_stack_00000008;
  std::__cxx11::string::_M_assign((string *)&this->data_folder);
  ppVar2 = (pwpo *)operator_new(0x10);
  ppVar2->previous = (pwpo *)0x0;
  pppVar3 = (particle **)malloc((long)this->page_size);
  ppVar2->head = pppVar3;
  this->npwpo = this->npwpo + 1;
  this->p_lapwpo = ppVar2;
  if (in_stack_00000018 == 0) {
    this_00 = (five_point_solver *)operator_new(0x50);
    fdtd_solver::fdtd_solver
              ((fdtd_solver *)this_00,&this->ce,&this->cb,&this->cj,this->dt,this->dx,this->dy,
               this->dz);
  }
  else if (in_stack_00000018 == 2) {
    this_00 = (five_point_solver *)operator_new(0x80);
    five_point_solver::five_point_solver
              (this_00,&this->ce,&this->cb,&this->cj,this->dt,this->dx,this->dy,this->dz);
  }
  else {
    if (in_stack_00000018 != 1) {
      pmVar6 = (this->solver)._M_t.
               super___uniq_ptr_impl<maxwell_solver,_std::default_delete<maxwell_solver>_>._M_t.
               super__Tuple_impl<0UL,_maxwell_solver_*,_std::default_delete<maxwell_solver>_>.
               super__Head_base<0UL,_maxwell_solver_*,_false>._M_head_impl;
      (this->solver)._M_t.
      super___uniq_ptr_impl<maxwell_solver,_std::default_delete<maxwell_solver>_>._M_t.
      super__Tuple_impl<0UL,_maxwell_solver_*,_std::default_delete<maxwell_solver>_>.
      super__Head_base<0UL,_maxwell_solver_*,_false>._M_head_impl = (maxwell_solver *)0x0;
      goto LAB_0011375c;
    }
    this_00 = (five_point_solver *)operator_new(0x70);
    ndfx_solver::ndfx_solver
              ((ndfx_solver *)this_00,&this->ce,&this->cb,&this->cj,this->dt,this->dx,this->dy,
               this->dz);
  }
  pmVar6 = (this->solver)._M_t.
           super___uniq_ptr_impl<maxwell_solver,_std::default_delete<maxwell_solver>_>._M_t.
           super__Tuple_impl<0UL,_maxwell_solver_*,_std::default_delete<maxwell_solver>_>.
           super__Head_base<0UL,_maxwell_solver_*,_false>._M_head_impl;
  (this->solver)._M_t.super___uniq_ptr_impl<maxwell_solver,_std::default_delete<maxwell_solver>_>.
  _M_t.super__Tuple_impl<0UL,_maxwell_solver_*,_std::default_delete<maxwell_solver>_>.
  super__Head_base<0UL,_maxwell_solver_*,_false>._M_head_impl = &this_00->super_maxwell_solver;
LAB_0011375c:
  if (pmVar6 != (maxwell_solver *)0x0) {
    (*pmVar6->_vptr_maxwell_solver[7])();
  }
  if (in_stack_00000020 == 0) {
    __f = push_vay;
  }
  else {
    if (in_stack_00000020 != 1) {
      p_Var5 = (this->advance_momentum).super__Function_base._M_manager;
      if (p_Var5 != (_Manager_type)0x0) {
        bVar1 = (*p_Var5)((_Any_data *)&this->advance_momentum,(_Any_data *)&this->advance_momentum,
                          __destroy_functor);
        p_Var5 = (_Manager_type)CONCAT71(extraout_var,bVar1);
        (this->advance_momentum).super__Function_base._M_manager = (_Manager_type)0x0;
        (this->advance_momentum)._M_invoker = (_Invoker_type)0x0;
      }
      return (int)p_Var5;
    }
    __f = push_boris;
  }
  pfVar4 = std::function<void(particle&,vector3d&,vector3d&,double&)>::operator=
                     ((function<void(particle&,vector3d&,vector3d&,double&)> *)
                      &this->advance_momentum,__f);
  return (int)pfVar4;
}

Assistant:

void spatial_region::init(int sr_id0, double dx0, double dy0, double dz0, double dt0, double e_s0, int xnpic0,
        int ynpic0, int znpic0, int n_ion_populations0, double* icmr0, std::string df,
        maxwell_solver_enum solver0, pusher_enum pusher)
{
    sr_id = sr_id0;
    dx = dx0;
    dy = dy0;
    dz = dz0;
    dt = dt0;
    e_s = e_s0;
    xnpic = xnpic0;
    ynpic = ynpic0;
    znpic = znpic0;
    n_ion_populations = n_ion_populations0;
    icmr = icmr0;
    data_folder = df;

    // we should always have at least one page for free particles (to avoid performance issues)
    pwpo* b = new pwpo;
    b->previous = 0;
    b->head = (particle**) malloc(page_size);
    npwpo++;
    p_lapwpo = b;

    switch (solver0) {
    case maxwell_solver_enum::NDFX:
        solver = unique_ptr<maxwell_solver>(new ndfx_solver(ce, cb, cj, dt, dx, dy, dz));
        break;
    case maxwell_solver_enum::FDTD:
        solver = unique_ptr<maxwell_solver>(new fdtd_solver(ce, cb, cj, dt, dx, dy, dz));
        break;
    case maxwell_solver_enum::FIVE_POINT:
        solver = unique_ptr<maxwell_solver>(new five_point_solver(ce, cb, cj, dt, dx, dy, dz));
        break;
    default:
        solver = nullptr;
    }

    switch (pusher) {
    case pusher_enum::BORIS:
        advance_momentum = push_boris;
        break;
    case pusher_enum::VAY:
        advance_momentum = push_vay;
        break;
    default:
        advance_momentum = nullptr;
    }
}